

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  mutex *__mutex;
  Socket *socket;
  ClientImpl *this_00;
  _Base_ptr p_Var1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__v;
  _Rb_tree_header *p_Var2;
  size_t *psVar3;
  anon_class_24_3_fff4cb3e SSL_connect_or_accept;
  int *piVar4;
  pthread_mutex_t *__mutex_00;
  bool bVar5;
  int iVar6;
  uint uVar7;
  SSL *pSVar8;
  pthread_t pVar9;
  iterator iVar10;
  _Rb_tree_node_base *p_Var11;
  Socket *unaff_RBX;
  undefined4 in_register_00000034;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar12;
  bool close_connection;
  _Alloc_node local_90;
  size_t sStack_88;
  Socket *local_80;
  Response *local_78;
  long local_70;
  int *local_68;
  pthread_mutex_t *local_60;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  local_70 = CONCAT44(in_register_00000034,__fd);
  local_78 = (Response *)__buf;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->request_mutex_);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  __mutex = &this->socket_mutex_;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  this->socket_should_be_closed_when_request_is_done_ = false;
  socket = &this->socket_;
  iVar6 = (this->socket_).sock;
  if (iVar6 == -1) {
LAB_001190b7:
    iVar6 = (*this->_vptr_ClientImpl[3])(this,socket,__n);
    if ((char)iVar6 == '\0') {
      bVar5 = false;
      unaff_RBX = (Socket *)0x0;
      goto LAB_001191c8;
    }
    iVar6 = (*this->_vptr_ClientImpl[6])(this);
    if ((char)iVar6 == '\0') goto LAB_001191b2;
    if (((this->proxy_host_)._M_string_length == 0) || (this->proxy_port_ == -1)) {
LAB_00119120:
      SSL_connect_or_accept.error = (Error *)__n;
      SSL_connect_or_accept.this = (SSLClient *)this;
      SSL_connect_or_accept.socket = socket;
      local_90._M_t =
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)this;
      sStack_88 = __n;
      local_80 = socket;
      pSVar8 = detail::
               ssl_new<httplib::SSLClient::initialize_ssl(httplib::ClientImpl::Socket&,httplib::Error&)::_lambda(ssl_st*)_1_,httplib::SSLClient::initialize_ssl(httplib::ClientImpl::Socket&,httplib::Error&)::_lambda(ssl_st*)_2_>
                         ((this->socket_).sock,(SSL_CTX *)this[1]._vptr_ClientImpl,
                          (mutex *)&this[1].host_,SSL_connect_or_accept,
                          (anon_class_8_1_8991fb9c)this);
      bVar5 = pSVar8 != (SSL *)0x0;
      if (pSVar8 == (SSL *)0x0) {
        if (socket->sock != -1) {
          shutdown(socket->sock,2);
        }
        if (socket->sock != -1) {
          close(socket->sock);
          socket->sock = -1;
        }
        unaff_RBX = (Socket *)0x0;
      }
      else {
        (this->socket_).ssl = pSVar8;
      }
    }
    else {
      local_90._M_t =
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)((ulong)local_90._M_t & 0xffffffffffffff00);
      bVar5 = SSLClient::connect_with_proxy
                        ((SSLClient *)this,socket,local_78,(bool *)&local_90,(Error *)__n);
      unaff_RBX = (Socket *)CONCAT71((int7)((ulong)unaff_RBX >> 8),(char)local_90._M_t);
      if (bVar5) goto LAB_00119120;
      bVar5 = false;
    }
    if (!bVar5) {
      bVar5 = false;
      goto LAB_001191c8;
    }
  }
  else {
    bVar5 = detail::is_socket_alive(iVar6);
    if (!bVar5) {
      (*this->_vptr_ClientImpl[4])(this,socket,0);
      if (socket->sock != -1) {
        shutdown(socket->sock,2);
      }
      if (socket->sock != -1) {
        close(socket->sock);
        socket->sock = -1;
      }
      unaff_RBX = socket;
      if (!bVar5) goto LAB_001190b7;
    }
  }
LAB_001191b2:
  this->socket_requests_in_flight_ = this->socket_requests_in_flight_ + 1;
  pVar9 = pthread_self();
  (this->socket_requests_are_from_thread_)._M_thread = pVar9;
  bVar5 = true;
LAB_001191c8:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar5) {
    p_Var11 = (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
    local_68 = (int *)__n;
    local_60 = (pthread_mutex_t *)__mutex;
    if ((_Rb_tree_header *)p_Var11 != p_Var2) {
      this_00 = (ClientImpl *)(local_70 + 0x40);
      p_Var1 = (_Base_ptr)(local_70 + 0x48);
      do {
        __v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(p_Var11 + 1);
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this_00,(key_type *)__v);
        if (iVar10._M_node == p_Var1) {
          pVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::_M_get_insert_equal_pos
                             ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this_00,(key_type *)__v);
          local_90._M_t =
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this_00;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::
          _M_insert_<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this_00,pVar12.first,pVar12.second,__v,&local_90);
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var2);
    }
    local_90._M_t =
         (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(CONCAT71(local_90._M_t._1_7_,this->keep_alive_) ^ 1);
    local_58 = (undefined8 *)0x0;
    uStack_50 = 0;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58 = (undefined8 *)operator_new(0x28);
    piVar4 = local_68;
    *local_58 = this;
    local_58[1] = local_70;
    local_58[2] = local_78;
    local_58[3] = &local_90;
    local_58[4] = local_68;
    pcStack_40 = std::
                 _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:6057:44)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:6057:44)>
               ::_M_manager;
    uVar7 = (*this->_vptr_ClientImpl[5])(this,socket);
    __mutex_00 = local_60;
    unaff_RBX = (Socket *)(ulong)uVar7;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    iVar6 = pthread_mutex_lock(__mutex_00);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    psVar3 = &this->socket_requests_in_flight_;
    *psVar3 = *psVar3 - 1;
    if (*psVar3 == 0) {
      (this->socket_requests_are_from_thread_)._M_thread = 0;
    }
    if (((this->socket_should_be_closed_when_request_is_done_ != false) || ((char)uVar7 == '\0')) ||
       ((char)local_90._M_t != '\0')) {
      (*this->_vptr_ClientImpl[4])(this,socket,1);
      if (socket->sock != -1) {
        shutdown(socket->sock,2);
      }
      if (socket->sock != -1) {
        close(socket->sock);
        socket->sock = -1;
      }
    }
    pthread_mutex_unlock(__mutex_00);
    if (*piVar4 == 0 && (char)uVar7 == '\0') {
      *piVar4 = 1;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->request_mutex_);
  return (ulong)unaff_RBX & 0xffffff01;
}

Assistant:

inline bool ClientImpl::send(Request& req, Response& res, Error& error) {
        std::lock_guard<std::recursive_mutex> request_mutex_guard(request_mutex_);

        {
            std::lock_guard<std::mutex> guard(socket_mutex_);

            // Set this to false immediately - if it ever gets set to true by the end of
            // the request, we know another thread instructed us to close the socket.
            socket_should_be_closed_when_request_is_done_ = false;

            auto is_alive = false;
            if (socket_.is_open()) {
                is_alive = detail::is_socket_alive(socket_.sock);
                if (!is_alive) {
                    // Attempt to avoid sigpipe by shutting down nongracefully if it seems
                    // like the other side has already closed the connection Also, there
                    // cannot be any requests in flight from other threads since we locked
                    // request_mutex_, so safe to close everything immediately
                    const bool shutdown_gracefully = false;
                    shutdown_ssl(socket_, shutdown_gracefully);
                    shutdown_socket(socket_);
                    close_socket(socket_);
                }
            }

            if (!is_alive) {
                if (!create_and_connect_socket(socket_, error)) { return false; }

            #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
                // TODO: refactoring
                if (is_ssl()) {
                    auto& scli = static_cast<SSLClient&>(*this);
                    if (!proxy_host_.empty() && proxy_port_ != -1) {
                        bool success = false;
                        if (!scli.connect_with_proxy(socket_, res, success, error)) {
                            return success;
                        }
                    }

                    if (!scli.initialize_ssl(socket_, error)) { return false; }
                }
            #endif
            }

            // Mark the current socket as being in use so that it cannot be closed by
            // anyone else while this request is ongoing, even though we will be
            // releasing the mutex.
            if (socket_requests_in_flight_ > 1) {
                assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
            }
            socket_requests_in_flight_ += 1;
            socket_requests_are_from_thread_ = std::this_thread::get_id();
        }

        for (const auto& header : default_headers_) {
            if (req.headers.find(header.first) == req.headers.end()) {
                req.headers.insert(header);
            }
        }

        auto close_connection = !keep_alive_;
        auto ret = process_socket(socket_, [&](Stream& strm) {
            return handle_request(strm, req, res, close_connection, error);
        });

        // Briefly lock mutex in order to mark that a request is no longer ongoing
        {
            std::lock_guard<std::mutex> guard(socket_mutex_);
            socket_requests_in_flight_ -= 1;
            if (socket_requests_in_flight_ <= 0) {
                assert(socket_requests_in_flight_ == 0);
                socket_requests_are_from_thread_ = std::thread::id();
            }

            if (socket_should_be_closed_when_request_is_done_ || close_connection ||
                !ret) {
                shutdown_ssl(socket_, true);
                shutdown_socket(socket_);
                close_socket(socket_);
            }
        }

        if (!ret) {
            if (error == Error::Success) { error = Error::Unknown; }
        }

        return ret;
    }